

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O0

int Pdr_ObjSatVar2(Pdr_Man_t *p,int k,Aig_Obj_t *pObj,int Level,int Pol)

{
  Aig_Man_t *p_00;
  sat_solver *psVar1;
  Pdr_Man_t *p_01;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pObj_00;
  int *piVar5;
  int *piVar6;
  int RetValue;
  int iClaEnd;
  int iClaBeg;
  int iVar;
  int i;
  int *pLit;
  int iVarThis;
  int fNewVar;
  sat_solver *pSat;
  Vec_Int_t *vLits;
  int Pol_local;
  int Level_local;
  Aig_Obj_t *pObj_local;
  Pdr_Man_t *pPStack_18;
  int k_local;
  Pdr_Man_t *p_local;
  
  pLit._4_4_ = 0;
  vLits._0_4_ = Pol;
  vLits._4_4_ = Level;
  _Pol_local = pObj;
  pObj_local._4_4_ = k;
  pPStack_18 = p;
  pLit._0_4_ = Pdr_ObjSatVar2FindOrAdd(p,k,pObj,(int *)((long)&pLit + 4));
  iVar2 = Aig_ObjIsCi(_Pol_local);
  if ((iVar2 == 0) && (pLit._4_4_ != 0)) {
    piVar5 = pPStack_18->pCnf2->pObj2Clause;
    iVar2 = Aig_ObjId(_Pol_local);
    iClaBeg = piVar5[iVar2];
    piVar5 = pPStack_18->pCnf2->pObj2Count;
    iVar2 = Aig_ObjId(_Pol_local);
    iVar2 = iClaBeg + piVar5[iVar2];
    if (iVar2 <= iClaBeg) {
      __assert_fail("iClaBeg < iClaEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                    ,0xd2,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
    }
    _iVarThis = Pdr_ManSolver(pPStack_18,pObj_local._4_4_);
    pSat = (sat_solver *)Vec_WecEntry(pPStack_18->vVLits,vLits._4_4_);
    for (; iClaBeg < iVar2; iClaBeg = iClaBeg + 1) {
      Vec_IntClear((Vec_Int_t *)pSat);
      psVar1 = pSat;
      iVar4 = (int)pLit;
      iVar3 = Abc_LitIsCompl(*pPStack_18->pCnf2->pClauses[iClaBeg]);
      iVar4 = Abc_Var2Lit(iVar4,iVar3);
      Vec_IntPush((Vec_Int_t *)psVar1,iVar4);
      _iVar = pPStack_18->pCnf2->pClauses[iClaBeg];
      while (p_01 = pPStack_18, iVar4 = pObj_local._4_4_, psVar1 = _iVarThis, _iVar = _iVar + 1,
            _iVar < pPStack_18->pCnf2->pClauses[iClaBeg + 1]) {
        p_00 = pPStack_18->pAig;
        iVar3 = Abc_Lit2Var(*_iVar);
        pObj_00 = Aig_ManObj(p_00,iVar3);
        iVar4 = Pdr_ObjSatVar2(p_01,iVar4,pObj_00,vLits._4_4_ + 1,(int)vLits);
        psVar1 = pSat;
        iVar3 = Abc_LitIsCompl(*_iVar);
        iVar4 = Abc_Var2Lit(iVar4,iVar3);
        Vec_IntPush((Vec_Int_t *)psVar1,iVar4);
      }
      piVar5 = Vec_IntArray((Vec_Int_t *)pSat);
      piVar6 = Vec_IntArray((Vec_Int_t *)pSat);
      iVar4 = Vec_IntSize((Vec_Int_t *)pSat);
      iVar4 = sat_solver_addclause(psVar1,piVar5,piVar6 + iVar4);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0xdf,"int Pdr_ObjSatVar2(Pdr_Man_t *, int, Aig_Obj_t *, int, int)");
      }
    }
    p_local._4_4_ = (int)pLit;
  }
  else {
    p_local._4_4_ = (int)pLit;
  }
  return p_local._4_4_;
}

Assistant:

int Pdr_ObjSatVar2( Pdr_Man_t * p, int k, Aig_Obj_t * pObj, int Level, int Pol )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    int fNewVar = 0, iVarThis  = Pdr_ObjSatVar2FindOrAdd( p, k, pObj, &fNewVar );
    int * pLit, i, iVar, iClaBeg, iClaEnd, RetValue;
    if ( Aig_ObjIsCi(pObj) || !fNewVar )
        return iVarThis;
    iClaBeg = p->pCnf2->pObj2Clause[Aig_ObjId(pObj)];
    iClaEnd = iClaBeg + p->pCnf2->pObj2Count[Aig_ObjId(pObj)];
    assert( iClaBeg < iClaEnd );
    pSat = Pdr_ManSolver(p, k);
    vLits = Vec_WecEntry( p->vVLits, Level );
    for ( i = iClaBeg; i < iClaEnd; i++ )
    {
        Vec_IntClear( vLits );
        Vec_IntPush( vLits, Abc_Var2Lit( iVarThis, Abc_LitIsCompl(p->pCnf2->pClauses[i][0]) ) );
        for ( pLit = p->pCnf2->pClauses[i]+1; pLit < p->pCnf2->pClauses[i+1]; pLit++ )
        {
            iVar = Pdr_ObjSatVar2( p, k, Aig_ManObj(p->pAig, Abc_Lit2Var(*pLit)), Level+1, Pol );
            Vec_IntPush( vLits, Abc_Var2Lit( iVar, Abc_LitIsCompl(*pLit) ) );
        }
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits)+Vec_IntSize(vLits) );
        assert( RetValue );
        (void) RetValue;
    }
    return iVarThis;
}